

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor_tests.cpp
# Opt level: O0

void check_csv_cursor_table<jsoncons::csv::basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>>
               (string *info,
               basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *cursor,
               string *expected_key,uint expected_value)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  undefined1 uVar1;
  ExprLhs<bool> EVar2;
  undefined1 uVar3;
  ExprLhs<bool> EVar4;
  Flags FVar5;
  basic_staj_event<char> *pbVar6;
  ExprLhs<const_jsoncons::staj_event_type_&> this;
  AssertionHandler *this_00;
  ExprLhs<const_jsoncons::staj_event_type_&> EVar7;
  ScopedMessage *this_01;
  long *in_RSI;
  AssertionHandler catchAssertionHandler_14;
  AssertionHandler catchAssertionHandler_13;
  AssertionHandler catchAssertionHandler_12;
  AssertionHandler catchAssertionHandler_11;
  AssertionHandler catchAssertionHandler_10;
  AssertionHandler catchAssertionHandler_9;
  AssertionHandler catchAssertionHandler_8;
  AssertionHandler catchAssertionHandler_7;
  AssertionHandler catchAssertionHandler_6;
  AssertionHandler catchAssertionHandler_5;
  AssertionHandler catchAssertionHandler_4;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage31;
  undefined4 in_stack_fffffffffffff468;
  Flags in_stack_fffffffffffff46c;
  undefined6 in_stack_fffffffffffff470;
  undefined1 in_stack_fffffffffffff476;
  undefined1 in_stack_fffffffffffff477;
  StringRef *in_stack_fffffffffffff478;
  SourceLineInfo *this_02;
  AssertionHandler *in_stack_fffffffffffff480;
  StringRef *in_stack_fffffffffffff488;
  MessageBuilder *in_stack_fffffffffffff490;
  SourceLineInfo *this_03;
  undefined2 in_stack_fffffffffffff498;
  undefined1 in_stack_fffffffffffff49a;
  undefined1 in_stack_fffffffffffff49b;
  undefined4 in_stack_fffffffffffff49c;
  AssertionHandler *in_stack_fffffffffffff4a0;
  ExprLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffff4a8;
  basic_staj_event<char> *in_stack_fffffffffffff4b0;
  undefined2 in_stack_fffffffffffff4b8;
  undefined1 in_stack_fffffffffffff4ba;
  undefined1 in_stack_fffffffffffff4bb;
  undefined4 in_stack_fffffffffffff4bc;
  ScopedMessage *in_stack_fffffffffffff4c0;
  SourceLineInfo local_a48;
  StringRef local_a38;
  staj_event_type local_9db;
  undefined1 local_9da;
  staj_event_type *local_9d8;
  SourceLineInfo local_990;
  StringRef local_980;
  undefined1 local_921;
  SourceLineInfo local_910;
  StringRef local_900;
  staj_event_type local_8a3;
  undefined1 local_8a2;
  staj_event_type *local_8a0;
  SourceLineInfo local_858;
  StringRef local_848;
  undefined1 local_7e9;
  SourceLineInfo local_7d8;
  StringRef local_7c8;
  uint local_770;
  uint *local_768;
  SourceLineInfo local_720;
  StringRef local_710;
  staj_event_type local_6b3;
  undefined1 local_6b2;
  staj_event_type *local_6b0;
  SourceLineInfo local_668;
  StringRef local_658;
  undefined1 local_5f9;
  SourceLineInfo local_5e8;
  StringRef local_5d8;
  string local_580 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_558;
  SourceLineInfo local_510;
  StringRef local_500;
  staj_event_type local_4a3;
  undefined1 local_4a2;
  staj_event_type *local_4a0;
  SourceLineInfo local_458;
  StringRef local_448;
  undefined1 local_3e9;
  SourceLineInfo local_3d8;
  StringRef local_3c8;
  staj_event_type local_36b;
  undefined1 local_36a;
  staj_event_type *local_368;
  SourceLineInfo local_320;
  StringRef local_310;
  undefined1 local_2b1;
  SourceLineInfo local_2a0;
  StringRef local_290;
  staj_event_type local_233;
  undefined1 local_232;
  staj_event_type *local_230;
  SourceLineInfo local_1e8;
  StringRef local_1d8;
  undefined1 local_179;
  SourceLineInfo local_168;
  StringRef local_158;
  SourceLineInfo local_f0;
  StringRef local_e0;
  long *local_10;
  
  local_10 = in_RSI;
  local_e0 = operator____catch_sr
                       ((char *)CONCAT17(in_stack_fffffffffffff477,
                                         CONCAT16(in_stack_fffffffffffff476,
                                                  in_stack_fffffffffffff470)),
                        CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_f0,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x3e4);
  Catch::MessageBuilder::MessageBuilder
            (in_stack_fffffffffffff490,in_stack_fffffffffffff488,
             (SourceLineInfo *)in_stack_fffffffffffff480,
             (OfType)((ulong)in_stack_fffffffffffff478 >> 0x20));
  Catch::MessageBuilder::operator<<
            ((MessageBuilder *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::ScopedMessage::ScopedMessage
            (in_stack_fffffffffffff4c0,
             (MessageBuilder *)
             CONCAT44(in_stack_fffffffffffff4bc,
                      CONCAT13(in_stack_fffffffffffff4bb,
                               CONCAT12(in_stack_fffffffffffff4ba,in_stack_fffffffffffff4b8))));
  Catch::MessageBuilder::~MessageBuilder
            ((MessageBuilder *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  local_158 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_168,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x3e6);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478);
  Catch::operator|(Normal,FalseTest);
  capturedExpression.m_size = (size_type)in_stack_fffffffffffff490;
  capturedExpression.m_start = (char *)in_stack_fffffffffffff488;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression,in_stack_fffffffffffff46c);
  (**(code **)(*local_10 + 0x18))();
  local_179 = Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468)
                         ,false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffff4a0,
             (ExprLhs<bool> *)
             CONCAT44(in_stack_fffffffffffff49c,
                      CONCAT13(in_stack_fffffffffffff49b,
                               CONCAT12(in_stack_fffffffffffff49a,in_stack_fffffffffffff498))));
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  local_1d8 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,999);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478);
  capturedExpression_00.m_size = (size_type)in_stack_fffffffffffff490;
  capturedExpression_00.m_start = (char *)in_stack_fffffffffffff488;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression_00,in_stack_fffffffffffff46c);
  local_232 = 0xe;
  local_230 = (staj_event_type *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468)
                         ,(staj_event_type *)0x43c246);
  pbVar6 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
  local_233 = jsoncons::basic_staj_event<char>::event_type(pbVar6);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((ExprLhs<const_jsoncons::staj_event_type_&> *)in_stack_fffffffffffff4a8,
             (staj_event_type *)in_stack_fffffffffffff4a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&>::
  ~BinaryExpr((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
              0x43c2d2);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  local_290 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2a0,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x3e9);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478);
  Catch::operator|(ContinueOnFailure,FalseTest);
  capturedExpression_01.m_size = (size_type)in_stack_fffffffffffff490;
  capturedExpression_01.m_start = (char *)in_stack_fffffffffffff488;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression_01,in_stack_fffffffffffff46c);
  (**(code **)(*local_10 + 0x18))();
  local_2b1 = Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468)
                         ,false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffff4a0,
             (ExprLhs<bool> *)
             CONCAT44(in_stack_fffffffffffff49c,
                      CONCAT13(in_stack_fffffffffffff49b,
                               CONCAT12(in_stack_fffffffffffff49a,in_stack_fffffffffffff498))));
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  (**(code **)(*local_10 + 0x38))();
  local_310 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_320,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x3eb);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478);
  capturedExpression_02.m_size = (size_type)in_stack_fffffffffffff490;
  capturedExpression_02.m_start = (char *)in_stack_fffffffffffff488;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression_02,in_stack_fffffffffffff46c);
  local_36a = 0xd;
  local_368 = (staj_event_type *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468)
                         ,(staj_event_type *)0x43c5f2);
  pbVar6 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
  local_36b = jsoncons::basic_staj_event<char>::event_type(pbVar6);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((ExprLhs<const_jsoncons::staj_event_type_&> *)in_stack_fffffffffffff4a8,
             (staj_event_type *)in_stack_fffffffffffff4a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&>::
  ~BinaryExpr((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
              0x43c67e);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  local_3c8 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_3d8,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x3ed);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478);
  Catch::operator|(ContinueOnFailure,FalseTest);
  capturedExpression_03.m_size = (size_type)in_stack_fffffffffffff490;
  capturedExpression_03.m_start = (char *)in_stack_fffffffffffff488;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression_03,in_stack_fffffffffffff46c);
  (**(code **)(*local_10 + 0x18))();
  local_3e9 = Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468)
                         ,false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffff4a0,
             (ExprLhs<bool> *)
             CONCAT44(in_stack_fffffffffffff49c,
                      CONCAT13(in_stack_fffffffffffff49b,
                               CONCAT12(in_stack_fffffffffffff49a,in_stack_fffffffffffff498))));
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  (**(code **)(*local_10 + 0x38))();
  local_448 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_458,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x3ef);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478);
  capturedExpression_04.m_size = (size_type)in_stack_fffffffffffff490;
  capturedExpression_04.m_start = (char *)in_stack_fffffffffffff488;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression_04,in_stack_fffffffffffff46c);
  local_4a2 = 0;
  local_4a0 = (staj_event_type *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468)
                         ,(staj_event_type *)0x43c99e);
  pbVar6 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
  local_4a3 = jsoncons::basic_staj_event<char>::event_type(pbVar6);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((ExprLhs<const_jsoncons::staj_event_type_&> *)in_stack_fffffffffffff4a8,
             (staj_event_type *)in_stack_fffffffffffff4a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&>::
  ~BinaryExpr((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
              0x43ca2a);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  local_500 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_510,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x3f0);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478);
  capturedExpression_05.m_size = (size_type)in_stack_fffffffffffff490;
  capturedExpression_05.m_start = (char *)in_stack_fffffffffffff488;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression_05,in_stack_fffffffffffff46c);
  (**(code **)(*local_10 + 0x20))();
  jsoncons::basic_staj_event<char>::get<std::__cxx11::string>
            ((basic_staj_event<char> *)
             CONCAT44(in_stack_fffffffffffff4bc,
                      CONCAT13(in_stack_fffffffffffff4bb,
                               CONCAT12(in_stack_fffffffffffff4ba,in_stack_fffffffffffff4b8))));
  local_558 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468)
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          0x43cbc2);
  Catch::ExprLhs<std::__cxx11::string_const&>::operator==
            (in_stack_fffffffffffff4a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::
  BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~BinaryExpr((BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 *)0x43cc1f);
  std::__cxx11::string::~string(local_580);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  local_5d8 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_5e8,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x3f2);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478);
  Catch::operator|(ContinueOnFailure,FalseTest);
  capturedExpression_06.m_size = (size_type)in_stack_fffffffffffff490;
  capturedExpression_06.m_start = (char *)in_stack_fffffffffffff488;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression_06,in_stack_fffffffffffff46c);
  (**(code **)(*local_10 + 0x18))();
  local_5f9 = Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468)
                         ,false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffff4a0,
             (ExprLhs<bool> *)
             CONCAT44(in_stack_fffffffffffff49c,
                      CONCAT13(in_stack_fffffffffffff49b,
                               CONCAT12(in_stack_fffffffffffff49a,in_stack_fffffffffffff498))));
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  (**(code **)(*local_10 + 0x38))();
  local_658 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_668,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x3f4);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478);
  capturedExpression_07.m_size = (size_type)in_stack_fffffffffffff490;
  capturedExpression_07.m_start = (char *)in_stack_fffffffffffff488;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression_07,in_stack_fffffffffffff46c);
  local_6b2 = 6;
  local_6b0 = (staj_event_type *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468)
                         ,(staj_event_type *)0x43cf6f);
  pbVar6 = (basic_staj_event<char> *)(**(code **)(*local_10 + 0x20))();
  local_6b3 = jsoncons::basic_staj_event<char>::event_type(pbVar6);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((ExprLhs<const_jsoncons::staj_event_type_&> *)in_stack_fffffffffffff4a8,
             (staj_event_type *)in_stack_fffffffffffff4a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&>::
  ~BinaryExpr((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
              0x43cff5);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  local_710 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_720,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x3f5);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478);
  capturedExpression_08.m_size = (size_type)in_stack_fffffffffffff490;
  capturedExpression_08.m_start = (char *)in_stack_fffffffffffff488;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression_08,in_stack_fffffffffffff46c);
  (**(code **)(*local_10 + 0x20))();
  local_770 = jsoncons::basic_staj_event<char>::get<unsigned_int>(in_stack_fffffffffffff4b0);
  local_768 = (uint *)Catch::Decomposer::operator<=
                                ((Decomposer *)
                                 CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                                 (uint *)0x43d188);
  Catch::ExprLhs<unsigned_int_const&>::operator==
            ((ExprLhs<const_unsigned_int_&> *)in_stack_fffffffffffff4a8,
             (uint *)in_stack_fffffffffffff4a0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::BinaryExpr<const_unsigned_int_&,_const_unsigned_int_&>::~BinaryExpr
            ((BinaryExpr<const_unsigned_int_&,_const_unsigned_int_&> *)0x43d1df);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  local_7c8 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_7d8,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x3f7);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478);
  Catch::operator|(ContinueOnFailure,FalseTest);
  capturedExpression_09.m_size = (size_type)in_stack_fffffffffffff490;
  capturedExpression_09.m_start = (char *)in_stack_fffffffffffff488;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression_09,in_stack_fffffffffffff46c);
  (**(code **)(*local_10 + 0x18))();
  local_7e9 = Catch::Decomposer::operator<=
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468)
                         ,false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffff4a0,
             (ExprLhs<bool> *)
             CONCAT44(in_stack_fffffffffffff49c,
                      CONCAT13(in_stack_fffffffffffff49b,
                               CONCAT12(in_stack_fffffffffffff49a,in_stack_fffffffffffff498))));
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  (**(code **)(*local_10 + 0x38))();
  local_848 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_858,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x3f9);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478);
  capturedExpression_10.m_size = (size_type)in_stack_fffffffffffff490;
  capturedExpression_10.m_start = (char *)in_stack_fffffffffffff488;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression_10,in_stack_fffffffffffff46c);
  local_8a2 = 7;
  this = Catch::Decomposer::operator<=
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                    (staj_event_type *)0x43d4e7);
  local_8a0 = this.m_lhs;
  this_00 = (AssertionHandler *)(**(code **)(*local_10 + 0x20))();
  local_8a3 = jsoncons::basic_staj_event<char>::event_type((basic_staj_event<char> *)this_00);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((ExprLhs<const_jsoncons::staj_event_type_&> *)this.m_lhs,(staj_event_type *)this_00);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&>::
  ~BinaryExpr((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
              0x43d567);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  local_900 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_910,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x3fb);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478);
  FVar5 = Catch::operator|(ContinueOnFailure,FalseTest);
  capturedExpression_11.m_size = (size_type)in_stack_fffffffffffff490;
  capturedExpression_11.m_start = (char *)in_stack_fffffffffffff488;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression_11,in_stack_fffffffffffff46c);
  uVar1 = (**(code **)(*local_10 + 0x18))();
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                     false);
  local_921 = EVar2;
  Catch::AssertionHandler::handleExpr<bool>
            (this_00,(ExprLhs<bool> *)
                     CONCAT44(FVar5,CONCAT13(uVar1,CONCAT12(EVar2.m_lhs,in_stack_fffffffffffff498)))
            );
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  (**(code **)(*local_10 + 0x38))();
  local_980 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  this_03 = &local_990;
  Catch::SourceLineInfo::SourceLineInfo
            (this_03,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x3fd);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffff480,(char *)in_stack_fffffffffffff478);
  capturedExpression_12.m_size = (size_type)this_03;
  capturedExpression_12.m_start = (char *)in_stack_fffffffffffff488;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffff480,in_stack_fffffffffffff478,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression_12,in_stack_fffffffffffff46c);
  local_9da = 0xf;
  EVar7 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                     (staj_event_type *)0x43d86f);
  local_9d8 = EVar7.m_lhs;
  this_01 = (ScopedMessage *)(**(code **)(*local_10 + 0x20))();
  local_9db = jsoncons::basic_staj_event<char>::event_type((basic_staj_event<char> *)this_01);
  Catch::ExprLhs<jsoncons::staj_event_type_const&>::operator==
            ((ExprLhs<const_jsoncons::staj_event_type_&> *)this.m_lhs,(staj_event_type *)this_00);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  Catch::BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&>::
  ~BinaryExpr((BinaryExpr<const_jsoncons::staj_event_type_&,_const_jsoncons::staj_event_type_&> *)
              0x43d8ef);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)));
  (**(code **)(*local_10 + 0x38))();
  local_a38 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff477,
                                          CONCAT16(in_stack_fffffffffffff476,
                                                   in_stack_fffffffffffff470)),
                         CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
  this_02 = &local_a48;
  Catch::SourceLineInfo::SourceLineInfo
            (this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/csv/src/csv_cursor_tests.cpp"
             ,0x400);
  Catch::StringRef::StringRef((StringRef *)this_01,(char *)this_02);
  capturedExpression_13.m_size = (size_type)this_03;
  capturedExpression_13.m_start = (char *)EVar7.m_lhs;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)this_01,(StringRef *)this_02,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff477,
                      CONCAT16(in_stack_fffffffffffff476,in_stack_fffffffffffff470)),
             capturedExpression_13,in_stack_fffffffffffff46c);
  uVar3 = (**(code **)(*local_10 + 0x18))();
  EVar4 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                     false);
  Catch::AssertionHandler::handleExpr<bool>
            (this_00,(ExprLhs<bool> *)
                     CONCAT44(FVar5,CONCAT13(uVar1,CONCAT12(EVar2.m_lhs,in_stack_fffffffffffff498)))
            );
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(uVar3,CONCAT16(EVar4.m_lhs,in_stack_fffffffffffff470)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(uVar3,CONCAT16(EVar4.m_lhs,in_stack_fffffffffffff470)));
  Catch::ScopedMessage::~ScopedMessage(this_01);
  return;
}

Assistant:

void check_csv_cursor_table(std::string info, CursorType& cursor,
                            std::string expected_key, unsigned expected_value)
{
    INFO(info);

    REQUIRE_FALSE(cursor.done());
    REQUIRE(staj_event_type::begin_array == cursor.current().event_type());

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::begin_object == cursor.current().event_type());

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::key == cursor.current().event_type());
    CHECK(cursor.current().template get<std::string>() == expected_key);

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::uint64_value == cursor.current().event_type());
    CHECK(cursor.current().template get<unsigned>() == expected_value);

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::end_object == cursor.current().event_type());

    CHECK_FALSE(cursor.done());
    cursor.next();
    REQUIRE(staj_event_type::end_array == cursor.current().event_type());

    cursor.next();
    CHECK(cursor.done());
}